

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O2

void __thiscall
DataStream::Xor(DataStream *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *key)

{
  byte *pbVar1;
  long in_FS_OFFSET;
  Span<const_std::byte> key_00;
  Span<std::byte> write;
  
  write.m_data = (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_start + this->m_read_pos;
  pbVar1 = (key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    write.m_size = (long)(this->vch).
                         super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)write.m_data;
    key_00.m_size =
         (long)(key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)pbVar1;
    key_00.m_data = pbVar1;
    util::Xor(write,key_00,0);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Xor(const std::vector<unsigned char>& key)
    {
        util::Xor(MakeWritableByteSpan(*this), MakeByteSpan(key));
    }